

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BackgroundThread.cpp
# Opt level: O3

void __thiscall amrex::BackgroundThread::~BackgroundThread(BackgroundThread *this)

{
  _Head_base<0UL,_std::thread_*,_false> _Var1;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  if ((this->m_thread)._M_t.super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>.
      _M_t.super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
      super__Head_base<0UL,_std::thread_*,_false>._M_head_impl != (thread *)0x0) {
    local_28._8_8_ = 0;
    local_10 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/Base/AMReX_BackgroundThread.cpp:13:16)>
               ::_M_invoke;
    local_18 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/Base/AMReX_BackgroundThread.cpp:13:16)>
               ::_M_manager;
    local_28._M_unused._M_object = this;
    Submit(this,(function<void_()> *)&local_28);
    if (local_18 != (code *)0x0) {
      (*local_18)(&local_28,&local_28,__destroy_functor);
    }
    std::thread::join();
    std::__uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>::reset
              ((__uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_> *)this,(pointer)0x0)
    ;
  }
  std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~deque
            (&(this->m_func).c);
  std::condition_variable::~condition_variable(&this->m_done_cond);
  std::condition_variable::~condition_variable(&this->m_job_cond);
  _Var1._M_head_impl =
       (this->m_thread)._M_t.super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>.
       _M_t.super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
       super__Head_base<0UL,_std::thread_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (thread *)0x0) {
    if ((native_handle_type)(_Var1._M_head_impl)->_M_id != 0) {
      std::terminate();
    }
    operator_delete(_Var1._M_head_impl,8);
  }
  (this->m_thread)._M_t.super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>._M_t.
  super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
  super__Head_base<0UL,_std::thread_*,_false>._M_head_impl = (thread *)0x0;
  return;
}

Assistant:

BackgroundThread::~BackgroundThread ()
{
    if (m_thread) {
        Submit([this] () { m_finalizing = true; });
        m_thread->join();
        m_thread.reset();
    }
}